

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantag.cpp
# Opt level: O2

string * __thiscall
YAML::ScanTagHandle_abi_cxx11_
          (string *__return_storage_ptr__,YAML *this,Stream *INPUT,bool *canBeHandle)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  int n;
  RegEx *pRVar4;
  ParserException *this_00;
  allocator local_59;
  Mark local_58;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  *(undefined1 *)&INPUT->m_input = 1;
  local_58.pos = 0;
  local_58.line = 0;
  local_58.column = 0;
  do {
    bVar2 = Stream::operator_cast_to_bool((Stream *)this);
    if (!bVar2) {
      return __return_storage_ptr__;
    }
    cVar3 = Stream::peek((Stream *)this);
    bVar1 = *(byte *)&INPUT->m_input;
    if (cVar3 == '!') {
      if (bVar1 != 0) {
        return __return_storage_ptr__;
      }
      this_00 = (ParserException *)__cxa_allocate_exception(0x40);
      std::__cxx11::string::string
                ((string *)&local_48,"illegal character found while scanning tag handle",&local_59);
      ParserException::ParserException(this_00,&local_58,&local_48);
      __cxa_throw(this_00,&ParserException::typeinfo,BadConversion::~BadConversion);
    }
    n = 0;
    if (bVar1 == 0) {
LAB_006a815d:
      if ((bVar1 & 1) == 0) goto LAB_006a8179;
    }
    else {
      pRVar4 = Exp::Word();
      n = RegEx::Match(pRVar4,(Stream *)this);
      if (0 < n) {
        bVar1 = *(byte *)&INPUT->m_input;
        goto LAB_006a815d;
      }
      *(undefined1 *)&INPUT->m_input = 0;
      local_58._0_8_ = *(undefined8 *)(this + 8);
      local_58.column = *(int *)(this + 0x10);
LAB_006a8179:
      pRVar4 = Exp::Tag();
      n = RegEx::Match(pRVar4,(Stream *)this);
    }
    if (n < 1) {
      return __return_storage_ptr__;
    }
    Stream::get_abi_cxx11_(&local_48,(Stream *)this,n);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_48);
  } while( true );
}

Assistant:

const std::string ScanTagHandle(Stream& INPUT, bool& canBeHandle) {
  std::string tag;
  canBeHandle = true;
  Mark firstNonWordChar;

  while (INPUT) {
    if (INPUT.peek() == Keys::Tag) {
      if (!canBeHandle)
        throw ParserException(firstNonWordChar, ErrorMsg::CHAR_IN_TAG_HANDLE);
      break;
    }

    int n = 0;
    if (canBeHandle) {
      n = Exp::Word().Match(INPUT);
      if (n <= 0) {
        canBeHandle = false;
        firstNonWordChar = INPUT.mark();
      }
    }

    if (!canBeHandle)
      n = Exp::Tag().Match(INPUT);

    if (n <= 0)
      break;

    tag += INPUT.get(n);
  }

  return tag;
}